

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

void __thiscall
ON_SubDEdge::CopyFrom
          (ON_SubDEdge *this,ON_SubDEdge *src,bool bReverseEdge,bool bCopyVertexArray,
          bool bCopyFaceArray,bool bCopySymmetrySetNext)

{
  ushort uVar1;
  uint uVar2;
  uint local_28;
  uint efi;
  uint face_count;
  uint end0;
  bool bCopySymmetrySetNext_local;
  bool bCopyFaceArray_local;
  bool bCopyVertexArray_local;
  bool bReverseEdge_local;
  ON_SubDEdge *src_local;
  ON_SubDEdge *this_local;
  
  _end0 = src;
  if (src == (ON_SubDEdge *)0x0) {
    _end0 = &Empty;
  }
  ON_SubDComponentBase::CopyBaseFrom
            (&this->super_ON_SubDComponentBase,&_end0->super_ON_SubDComponentBase,
             bCopySymmetrySetNext);
  this->m_next_edge = (ON_SubDEdge *)0x0;
  this->m_edge_tag = _end0->m_edge_tag;
  *(undefined8 *)(this->m_sharpness).m_edge_sharpness =
       *(undefined8 *)(_end0->m_sharpness).m_edge_sharpness;
  uVar2 = (uint)bReverseEdge;
  if (bCopyVertexArray) {
    this->m_vertex[0] = _end0->m_vertex[uVar2];
    this->m_vertex[1] = _end0->m_vertex[1 - uVar2];
  }
  this->m_sector_coefficient[0] = _end0->m_sector_coefficient[uVar2];
  this->m_sector_coefficient[1] = _end0->m_sector_coefficient[1 - uVar2];
  if (bCopyFaceArray) {
    if ((_end0->m_face_count == 0) ||
       ((2 < _end0->m_face_count &&
        ((_end0->m_facex == (ON_SubDFacePtr *)0x0 || (this->m_facex == (ON_SubDFacePtr *)0x0)))))) {
      this->m_face_count = 0;
    }
    else {
      this->m_face2[0].m_ptr = _end0->m_face2[0].m_ptr;
      this->m_face2[1].m_ptr = _end0->m_face2[1].m_ptr;
      uVar1 = _end0->m_face_count;
      if (2 < uVar1) {
        for (local_28 = 0; local_28 < uVar1 - 2; local_28 = local_28 + 1) {
          this->m_facex[local_28].m_ptr = _end0->m_facex[local_28].m_ptr;
        }
      }
      this->m_face_count = _end0->m_face_count;
    }
  }
  return;
}

Assistant:

void ON_SubDEdge::CopyFrom(
  const ON_SubDEdge* src,
  bool bReverseEdge,
  bool bCopyVertexArray,
  bool bCopyFaceArray,
  bool bCopySymmetrySetNext
)
{
  if (nullptr == src)
    src = &ON_SubDEdge::Empty;

  CopyBaseFrom(src, bCopySymmetrySetNext);

  m_next_edge = nullptr;
  
  m_edge_tag = src->m_edge_tag;

  m_sharpness = src->m_sharpness;

  unsigned int end0 = bReverseEdge ? 1 : 0;

  if (bCopyVertexArray)
  {
    m_vertex[0] = src->m_vertex[end0];
    m_vertex[1] = src->m_vertex[1 - end0];
  }

  m_sector_coefficient[0] = src->m_sector_coefficient[end0];
  m_sector_coefficient[1] = src->m_sector_coefficient[1 - end0];

  if (bCopyFaceArray)
  {
    if (src->m_face_count > 0 && (src->m_face_count <= 2 || (nullptr != src->m_facex && nullptr != m_facex)))
    {
      m_face2[0] = src->m_face2[0];
      m_face2[1] = src->m_face2[1];
      unsigned int face_count = src->m_face_count;
      if (face_count > 2)
      {
        face_count -= 2;
        for (unsigned int efi = 0; efi < face_count; efi++)
          m_facex[efi] = src->m_facex[efi];
      }
      m_face_count = src->m_face_count;
    }
    else
      m_face_count = 0;
  }
}